

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitemanimation.cpp
# Opt level: O0

void __thiscall QGraphicsItemAnimation::setStep(QGraphicsItemAnimation *this,qreal step)

{
  bool bVar1;
  QGraphicsItem *in_RDI;
  long in_FS_OFFSET;
  QTransform *in_XMM0_Qa;
  char *in_stack_ffffffffffffff18;
  _func_int **pp_Var2;
  qreal in_stack_ffffffffffffff20;
  QPointF *pos;
  QGraphicsItem *this_00;
  QPointF in_stack_ffffffffffffff48;
  qreal in_stack_ffffffffffffff60;
  QGraphicsItemAnimation *in_stack_ffffffffffffff68;
  QTransform local_58;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar1 = check_step_valid(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  if (bVar1) {
    (*in_RDI->_vptr_QGraphicsItem[0xc])(in_XMM0_Qa);
    in_RDI[1]._vptr_QGraphicsItem[0x10] = (_func_int *)in_XMM0_Qa;
    if (in_RDI[1]._vptr_QGraphicsItem[3] != (_func_int *)0x0) {
      bVar1 = QList<QGraphicsItemAnimationPrivate::Pair>::isEmpty
                        ((QList<QGraphicsItemAnimationPrivate::Pair> *)0xa62268);
      if ((!bVar1) ||
         (bVar1 = QList<QGraphicsItemAnimationPrivate::Pair>::isEmpty
                            ((QList<QGraphicsItemAnimationPrivate::Pair> *)0xa62283), !bVar1)) {
        pos = (QPointF *)in_RDI[1]._vptr_QGraphicsItem[3];
        in_stack_ffffffffffffff48 = posAt(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
        QGraphicsItem::setPos(in_RDI,pos);
      }
      bVar1 = QList<QGraphicsItemAnimationPrivate::Pair>::isEmpty
                        ((QList<QGraphicsItemAnimationPrivate::Pair> *)0xa622d4);
      if ((((!bVar1) ||
           (bVar1 = QList<QGraphicsItemAnimationPrivate::Pair>::isEmpty
                              ((QList<QGraphicsItemAnimationPrivate::Pair> *)0xa622f2), !bVar1)) ||
          (bVar1 = QList<QGraphicsItemAnimationPrivate::Pair>::isEmpty
                             ((QList<QGraphicsItemAnimationPrivate::Pair> *)0xa62310), !bVar1)) ||
         (((bVar1 = QList<QGraphicsItemAnimationPrivate::Pair>::isEmpty
                              ((QList<QGraphicsItemAnimationPrivate::Pair> *)0xa6232b), !bVar1 ||
           (bVar1 = QList<QGraphicsItemAnimationPrivate::Pair>::isEmpty
                              ((QList<QGraphicsItemAnimationPrivate::Pair> *)0xa62346), !bVar1)) ||
          ((bVar1 = QList<QGraphicsItemAnimationPrivate::Pair>::isEmpty
                              ((QList<QGraphicsItemAnimationPrivate::Pair> *)0xa62361), !bVar1 ||
           (bVar1 = QList<QGraphicsItemAnimationPrivate::Pair>::isEmpty
                              ((QList<QGraphicsItemAnimationPrivate::Pair> *)0xa6237c), !bVar1))))))
      {
        pp_Var2 = in_RDI[1]._vptr_QGraphicsItem + 6;
        transformAt((QGraphicsItemAnimation *)in_stack_ffffffffffffff48.yp,
                    in_stack_ffffffffffffff48.xp);
        QTransform::operator*(&local_58,(QTransform *)pp_Var2);
        QGraphicsItem::setTransform(this_00,in_XMM0_Qa,SUB81((ulong)in_RDI >> 0x38,0));
      }
    }
    (*in_RDI->_vptr_QGraphicsItem[0xd])(in_XMM0_Qa);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItemAnimation::setStep(qreal step)
{
    if (!check_step_valid(step, "setStep"))
        return;

    beforeAnimationStep(step);

    d->step = step;
    if (d->item) {
        if (!d->xPosition.isEmpty() || !d->yPosition.isEmpty())
            d->item->setPos(posAt(step));
        if (!d->rotation.isEmpty()
            || !d->verticalScale.isEmpty()
            || !d->horizontalScale.isEmpty()
            || !d->verticalShear.isEmpty()
            || !d->horizontalShear.isEmpty()
            || !d->xTranslation.isEmpty()
            || !d->yTranslation.isEmpty()) {
            d->item->setTransform(d->startTransform * transformAt(step));
        }
    }

    afterAnimationStep(step);
}